

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_test.c
# Opt level: O0

char * reset_histogram_on_sample_and_recycle(void)

{
  _Bool _Var1;
  hdr_histogram *phVar2;
  hdr_histogram *sample2;
  hdr_histogram *sample1;
  hdr_histogram *inactive1;
  hdr_interval_recorder recorder;
  
  hdr_interval_recorder_init_all((hdr_interval_recorder *)&inactive1,1,86400000000,3);
  hdr_interval_recorder_record_value((hdr_interval_recorder *)&inactive1,0x4d2);
  phVar2 = hdr_interval_recorder_sample_and_recycle
                     ((hdr_interval_recorder *)&inactive1,(hdr_histogram *)0x0);
  _Var1 = compare_int64(1,phVar2->total_count);
  if (_Var1) {
    phVar2 = hdr_interval_recorder_sample_and_recycle((hdr_interval_recorder *)&inactive1,phVar2);
    phVar2 = hdr_interval_recorder_sample_and_recycle((hdr_interval_recorder *)&inactive1,phVar2);
    _Var1 = compare_int64(0,phVar2->total_count);
    if (_Var1) {
      recorder.phaser.reader_mutex = (hdr_mutex *)0x0;
    }
    else {
      recorder.phaser.reader_mutex = (hdr_mutex *)anon_var_dwarf_636;
    }
  }
  else {
    recorder.phaser.reader_mutex = (hdr_mutex *)anon_var_dwarf_62b;
  }
  return (char *)recorder.phaser.reader_mutex;
}

Assistant:

static char* reset_histogram_on_sample_and_recycle(void)
{
    struct hdr_interval_recorder recorder;
    struct hdr_histogram* inactive1;
    struct hdr_histogram* sample1;
    struct hdr_histogram* sample2;

    inactive1 = NULL;

    hdr_interval_recorder_init_all(&recorder, 1, INT64_C(24) * 60 * 60 * 1000000, 3);

    hdr_interval_recorder_record_value(&recorder, 1234);

    sample1 = hdr_interval_recorder_sample_and_recycle(&recorder, inactive1);

    mu_assert("Should have at least one value", compare_int64(1, sample1->total_count));

    sample2 = hdr_interval_recorder_sample_and_recycle(&recorder, sample1);
    sample1 = hdr_interval_recorder_sample_and_recycle(&recorder, sample2);

    mu_assert("Should have been reset", compare_int64(0, sample1->total_count));

    return 0;
}